

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Gia_ManComputeEdgeDelay(Gia_Man_t *p,int fUseTwo)

{
  ulong uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  char *__function;
  int iVar5;
  uint uVar6;
  char *__file;
  char *__assertion;
  uint uVar7;
  long lVar8;
  size_t __size;
  long lVar9;
  float fVar10;
  
  pVVar3 = p->vEdgeDelay;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vEdgeDelay->pArray = (int *)0x0;
      pVVar3 = p->vEdgeDelay;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_001f839a;
    }
    free(pVVar3);
    p->vEdgeDelay = (Vec_Int_t *)0x0;
  }
LAB_001f839a:
  pVVar3 = p->vEdge1;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vEdge1->pArray = (int *)0x0;
      pVVar3 = p->vEdge1;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_001f83e2;
    }
    free(pVVar3);
    p->vEdge1 = (Vec_Int_t *)0x0;
  }
LAB_001f83e2:
  pVVar3 = p->vEdge2;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vEdge2->pArray = (int *)0x0;
      pVVar3 = p->vEdge2;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_001f8423;
    }
    free(pVVar3);
  }
LAB_001f8423:
  iVar2 = p->nObjs;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar5 = iVar2;
  }
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = iVar2;
    p->vEdge1 = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 0;
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = iVar2;
    p->vEdge2 = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 0;
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = iVar2;
  }
  else {
    lVar8 = (long)iVar2;
    __size = (long)iVar5 << 2;
    piVar4 = (int *)malloc(__size);
    pVVar3->pArray = piVar4;
    pVVar3->nSize = iVar2;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,lVar8 * 4);
    }
    p->vEdge1 = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = iVar5;
    piVar4 = (int *)malloc(__size);
    pVVar3->pArray = piVar4;
    pVVar3->nSize = iVar2;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,lVar8 * 4);
    }
    p->vEdge2 = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = iVar5;
    piVar4 = (int *)malloc(__size);
    pVVar3->pArray = piVar4;
    pVVar3->nSize = iVar2;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,lVar8 << 2);
    }
  }
  p->vEdgeDelay = pVVar3;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    if (p->vMapping2 == (Vec_Wec_t *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x1d7,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
    }
    if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
      iVar2 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime);
      if (iVar2 != 0) {
        pVVar3 = Gia_ManOrderWithBoxes(p);
        Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
        if (0 < pVVar3->nSize) {
          lVar8 = 0;
          do {
            iVar2 = pVVar3->pArray[lVar8];
            lVar9 = (long)iVar2;
            if ((lVar9 < 0) || (p->nObjs <= iVar2)) goto LAB_001f8a44;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            uVar1 = *(ulong *)(p->pObjs + lVar9);
            uVar7 = (uint)uVar1;
            if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
              uVar6 = (uint)(uVar1 >> 0x20);
              if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
                if (-1 < (int)uVar7) goto LAB_001f8aa1;
                fVar10 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,uVar6 & 0x1fffffff);
                if (p->vEdgeDelay->nSize <= iVar2) goto LAB_001f8a82;
                p->vEdgeDelay->pArray[lVar9] = (int)fVar10;
              }
              else if ((int)uVar7 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
                uVar7 = iVar2 - (uVar7 & 0x1fffffff);
                if (((int)uVar7 < 0) || (p->vEdgeDelay->nSize <= (int)uVar7)) goto LAB_001f8a25;
                Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,uVar6 & 0x1fffffff,
                                    (float)p->vEdgeDelay->pArray[uVar7]);
              }
              else if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                              ,0x1cd,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
              }
            }
            else {
              if (p->vMapping2->nSize <= iVar2) goto LAB_001f8a63;
              if (p->vMapping2->pArray[lVar9].nSize != 0) {
                Gia_ObjComputeEdgeDelay(p,iVar2,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
              }
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < pVVar3->nSize);
        }
        goto LAB_001f88c1;
      }
      iVar2 = p->nObjs;
    }
    if (1 < iVar2) {
      lVar8 = 1;
      lVar9 = 0x14;
      do {
        if (p->vMapping2->nSize <= lVar8) {
LAB_001f8a63:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if (*(int *)((long)&p->vMapping2->pArray->nCap + lVar9) != 0) {
          Gia_ObjComputeEdgeDelay(p,(int)lVar8,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
          iVar2 = p->nObjs;
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 < iVar2);
    }
  }
  else {
    if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
      iVar2 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime);
      if (iVar2 != 0) {
        pVVar3 = Gia_ManOrderWithBoxes(p);
        Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
        if (0 < pVVar3->nSize) {
          lVar8 = 0;
          do {
            iVar2 = pVVar3->pArray[lVar8];
            lVar9 = (long)iVar2;
            if ((lVar9 < 0) || (p->nObjs <= iVar2)) goto LAB_001f8a44;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            uVar1 = *(ulong *)(p->pObjs + lVar9);
            uVar7 = (uint)uVar1;
            if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
              uVar6 = (uint)(uVar1 >> 0x20);
              if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
                if (-1 < (int)uVar7) {
LAB_001f8aa1:
                  __assert_fail("pObj->fTerm",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
                }
                fVar10 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,uVar6 & 0x1fffffff);
                if (p->vEdgeDelay->nSize <= iVar2) {
LAB_001f8a82:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                p->vEdgeDelay->pArray[lVar9] = (int)fVar10;
              }
              else if ((int)uVar7 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
                uVar7 = iVar2 - (uVar7 & 0x1fffffff);
                if (((int)uVar7 < 0) || (p->vEdgeDelay->nSize <= (int)uVar7)) goto LAB_001f8a25;
                Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,uVar6 & 0x1fffffff,
                                    (float)p->vEdgeDelay->pArray[uVar7]);
              }
              else if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
                __assertion = "0";
                __file = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ;
                __function = "int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)";
                goto LAB_001f8a3a;
              }
            }
            else {
              if (p->vMapping->nSize <= iVar2) goto LAB_001f8a25;
              if (p->vMapping->pArray[lVar9] != 0) {
                Gia_ObjComputeEdgeDelay(p,iVar2,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
              }
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < pVVar3->nSize);
        }
LAB_001f88c1:
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
        }
        free(pVVar3);
        goto LAB_001f89ae;
      }
      iVar2 = p->nObjs;
    }
    if (1 < iVar2) {
      lVar8 = 1;
      do {
        if (p->vMapping->nSize <= lVar8) goto LAB_001f8a25;
        if (p->vMapping->pArray[lVar8] != 0) {
          Gia_ObjComputeEdgeDelay(p,(int)lVar8,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
          iVar2 = p->nObjs;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar2);
    }
  }
LAB_001f89ae:
  lVar8 = (long)p->vCos->nSize;
  if (lVar8 < 1) {
    iVar2 = 0;
  }
  else {
    lVar9 = 0;
    iVar2 = 0;
    do {
      iVar5 = p->vCos->pArray[lVar9];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_001f8a44:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar7 = iVar5 - (*(uint *)(p->pObjs + iVar5) & 0x1fffffff);
      if (((int)uVar7 < 0) || (p->vEdgeDelay->nSize <= (int)uVar7)) {
LAB_001f8a25:
        __assertion = "i >= 0 && i < p->nSize";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h";
        __function = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_001f8a3a:
        __assert_fail(__assertion,__file,0x1a9,__function);
      }
      iVar5 = p->vEdgeDelay->pArray[uVar7];
      if (iVar2 <= iVar5) {
        iVar2 = iVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  return iVar2;
}

Assistant:

int Gia_ManComputeEdgeDelay( Gia_Man_t * p, int fUseTwo )
{
    int k, iLut, DelayMax = 0;
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    if ( Gia_ManHasMapping(p) )
    {
        if ( p->pManTime != NULL && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) )
        {
            Gia_Obj_t * pObj; 
            Vec_Int_t * vNodes = Gia_ManOrderWithBoxes( p );
            Tim_ManIncrementTravId( (Tim_Man_t*)p->pManTime );
            Gia_ManForEachObjVec( vNodes, p, pObj, k )
            {
                iLut = Gia_ObjId( p, pObj );
                if ( Gia_ObjIsAnd(pObj) )
                {
                    if ( Gia_ObjIsLut(p, iLut) )
                        Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
                }
                else if ( Gia_ObjIsCi(pObj) )
                {
                    int arrTime = Tim_ManGetCiArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj) );
                    Vec_IntWriteEntry( p->vEdgeDelay,  iLut, arrTime );
                }
                else if ( Gia_ObjIsCo(pObj) )
                {
                    int arrTime = Vec_IntEntry( p->vEdgeDelay, Gia_ObjFaninId0(pObj, iLut) );
                    Tim_ManSetCoArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj), arrTime );
                }
                else if ( !Gia_ObjIsConst0(pObj) ) 
                    assert( 0 );
            }
            Vec_IntFree( vNodes );
        }
        else
        {
            Gia_ManForEachLut( p, iLut )
                Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        }
    }
    else if ( Gia_ManHasMapping2(p) )
    {
        if ( p->pManTime != NULL && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) )
        {
            Gia_Obj_t * pObj; 
            Vec_Int_t * vNodes = Gia_ManOrderWithBoxes( p );
            Tim_ManIncrementTravId( (Tim_Man_t*)p->pManTime );
            Gia_ManForEachObjVec( vNodes, p, pObj, k )
            {
                iLut = Gia_ObjId( p, pObj );
                if ( Gia_ObjIsAnd(pObj) )
                {
                    if ( Gia_ObjIsLut2(p, iLut) )
                        Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
                }
                else if ( Gia_ObjIsCi(pObj) )
                {
                    int arrTime = Tim_ManGetCiArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj) );
                    Vec_IntWriteEntry( p->vEdgeDelay,  iLut, arrTime );
                }
                else if ( Gia_ObjIsCo(pObj) )
                {
                    int arrTime = Vec_IntEntry( p->vEdgeDelay, Gia_ObjFaninId0(pObj, iLut) );
                    Tim_ManSetCoArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj), arrTime );
                }
                else if ( !Gia_ObjIsConst0(pObj) ) 
                    assert( 0 );
            }
            Vec_IntFree( vNodes );
        }
        else
        {
            Gia_ManForEachLut2( p, iLut )
                Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        }
    }
    else assert( 0 );
    Gia_ManForEachCoDriverId( p, iLut, k )
        DelayMax = Abc_MaxInt( DelayMax, Vec_IntEntry(p->vEdgeDelay, iLut) );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(p), DelayMax );
    return DelayMax;
}